

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O3

bool __thiscall Moves::TryAttack(Moves *this,Move *m,Board *board,int id,int jd)

{
  pointer *ppMVar1;
  iterator __position;
  Square SVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  uint uVar7;
  uint uVar8;
  Move myMove;
  Move local_58;
  Square local_30;
  NoPiece *pNVar6;
  
  local_58.m_Piece._0_4_ = *(undefined4 *)&m->m_Piece;
  local_58.m_Piece._4_4_ = *(undefined4 *)((long)&m->m_Piece + 4);
  local_58.m_Source.i = (m->m_Source).i;
  local_58.m_Source.j = (m->m_Source).j;
  local_58.m_Score = m->m_Score;
  local_58._28_4_ = *(undefined4 *)&m->field_0x1c;
  local_58.m_PromoteTo = m->m_PromoteTo;
  uVar8 = id + local_58.m_Source.i;
  uVar7 = local_58.m_Source.j + jd;
  local_58.m_Dest.j = uVar7;
  local_58.m_Dest.i = uVar8;
  if (uVar7 < 8 && uVar8 < 8) {
    local_30 = local_58.m_Dest;
    iVar4 = (*m->m_Piece->_vptr_Piece[4])(m->m_Piece,&local_30,board);
    iVar5 = (*(board->super_BoardPieceSquare).super_BoardHashing.super_BoardBase._vptr_BoardBase[1])
                      (board,(ulong)(uVar8 + uVar7 * 8));
    pNVar6 = (NoPiece *)CONCAT44(extraout_var,iVar5);
    if ((char)iVar4 == '\0') {
      if (pNVar6 != &None) goto LAB_00110e28;
      local_58.m_Score = 0;
    }
    else {
      local_58.m_Score = (**(pNVar6->super_Piece)._vptr_Piece)(pNVar6);
    }
    __position._M_current =
         (this->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Move,std::allocator<Move>>::_M_realloc_insert<Move_const&>
                ((vector<Move,std::allocator<Move>> *)this,__position,&local_58);
    }
    else {
      (__position._M_current)->m_PromoteTo = local_58.m_PromoteTo;
      SVar2.j = local_58.m_Source.j;
      SVar2.i = local_58.m_Source.i;
      (__position._M_current)->m_Dest = local_58.m_Dest;
      *(ulong *)&(__position._M_current)->m_Score = CONCAT44(local_58._28_4_,local_58.m_Score);
      (__position._M_current)->m_Piece =
           (Piece *)CONCAT44(local_58.m_Piece._4_4_,local_58.m_Piece._0_4_);
      (__position._M_current)->m_Source = SVar2;
      ppMVar1 = &(this->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    bVar3 = true;
  }
  else {
LAB_00110e28:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool TryAttack( const Move &m, const Board &board, int id, int jd )
    {
        Move myMove = m;

        myMove.Dest( Square( id + myMove.Source().I(), jd + myMove.Source().J() ) );

        if ( myMove.Dest().IsOnBoard() )
        {
            // Captures are more interesting than moves.
            if ( myMove.GetPiece()->IsDifferent( myMove.Dest(), board ) )
            {
                myMove.Score( board.Get( myMove.Dest() )->PieceValue() );
                Add( myMove );
                return true;
            }
            else if ( board.IsEmpty( myMove.Dest() ) )
            {
                myMove.Score( None.PieceValue() );
                Add( myMove );
                return true;
            }
        }

        return false;
    }